

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_atom.c
# Opt level: O2

t_symbol * atom_gensym(t_atom *a)

{
  t_symbol *ptVar1;
  char buf [30];
  char local_28 [40];
  
  if (a->a_type == A_FLOAT) {
    sprintf(local_28,"%g",(double)(a->a_w).w_float);
  }
  else {
    if (a->a_type == A_SYMBOL) {
      return (a->a_w).w_symbol;
    }
    builtin_strncpy(local_28,"???",4);
  }
  ptVar1 = gensym(local_28);
  return ptVar1;
}

Assistant:

t_symbol *atom_gensym(const t_atom *a)  /* this works  better for graph labels */
{
    char buf[30];
    if (a->a_type == A_SYMBOL) return (a->a_w.w_symbol);
    else if (a->a_type == A_FLOAT)
        sprintf(buf, "%g", a->a_w.w_float);
    else strcpy(buf, "???");
    return (gensym(buf));
}